

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compilation_context.cpp
# Opt level: O2

void __thiscall
CompilationContext::offsetToLineAndCol(CompilationContext *this,int offset,int *line,int *col)

{
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  char cVar5;
  
  *line = 1;
  *col = 1;
  bVar2 = is_utf8_bom((this->code)._M_dataplus._M_p,0);
  iVar3 = (uint)bVar2 + (uint)bVar2 * 2;
  iVar4 = (int)(this->code)._M_string_length;
  if (offset < iVar4) {
    iVar4 = offset;
  }
  pcVar1 = (this->code)._M_dataplus._M_p;
  for (; iVar3 < iVar4; iVar3 = iVar3 + 1) {
    *col = *col + 1;
    cVar5 = pcVar1[iVar3];
    if (cVar5 == '\r') {
      if (pcVar1[(long)iVar3 + 1] == '\n') {
        iVar3 = iVar3 + 1;
      }
      cVar5 = pcVar1[iVar3];
    }
    if ((cVar5 == '\r') || (cVar5 == '\n')) {
      *line = *line + 1;
      *col = 1;
    }
  }
  return;
}

Assistant:

void CompilationContext::offsetToLineAndCol(int offset, int & line, int & col) const
{
  line = 1;
  col = 1;
  int start = is_utf8_bom(code.c_str(), 0) ? 3 : 0;

  for (int i = start; i < int(code.length()); i++)
  {
    if (offset - 1 < i)
      break;

    col++;

    if (code[i] == 0x0d && code[i + 1] == 0x0a)
      i++;

    if (code[i] == 0x0d || code[i] == 0x0a)
    {
      line++;
      col = 1;
    }
  }
}